

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.h
# Opt level: O1

string * __thiscall
cmGlobalUnixMakefileGenerator3::GetName_abi_cxx11_(cmGlobalUnixMakefileGenerator3 *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x6b614d2078696e55;
  *(undefined8 *)((long)&in_RDI->field_2 + 6) = 0x73656c6966656b61;
  in_RDI->_M_string_length = 0xe;
  (in_RDI->field_2)._M_local_buf[0xe] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string GetName() const {
    return cmGlobalUnixMakefileGenerator3::GetActualName();}